

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.c
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  char *__dest;
  char *buffer;
  char *msg;
  char **argv_local;
  int argc_local;
  
  sVar1 = strlen("hello world");
  __dest = (char *)mymalloc(sVar1 + 1);
  sVar1 = strlen("hello world");
  memset(__dest,0,sVar1 + 1);
  sVar1 = strlen("hello world");
  strncpy(__dest,"hello world",sVar1 + 1);
  printf("%s\n",__dest);
  myfree(__dest);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    const char* msg = "hello world";
    char *buffer = (char*)mymalloc(strlen(msg) + 1);
    memset(buffer, 0, strlen(msg)+1);
    strncpy(buffer, msg, strlen(msg)+1);
    printf("%s\n", buffer);
    myfree(buffer);
    return 0;
}